

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  int64_t iVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x88,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
  }
  iVar6 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar6) {
    sVar1 = (x->data_).size_;
    sVar7 = Matrix::size(&this->super_Matrix,1);
    if (sVar1 != sVar7) {
      __assert_fail("x.size() == this->size(1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                    ,0x8a,
                    "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const");
    }
    lVar2 = (this->super_Matrix).n_;
    if (0 < lVar2) {
      lVar9 = (ulong)(uint)i * lVar2;
      uVar3 = (this->data_).size_;
      pfVar4 = (x->data_).mem_;
      pfVar5 = (this->data_).mem_;
      lVar8 = 0;
      do {
        if (uVar3 <= (ulong)(lVar9 + lVar8)) {
          __assert_fail("i * n_ + j < data_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.h"
                        ,0x31,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
        }
        pfVar4[lVar8] = pfVar5[lVar9 + lVar8] + pfVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar2 != lVar8);
    }
    return;
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x89,"virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += at(i, j);
  }
}